

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dl-blob-type.cpp
# Opt level: O0

void __thiscall
yactfr::DynamicLengthBlobType::DynamicLengthBlobType
          (DynamicLengthBlobType *this,uint align,DataLocation *lenLoc,Up *attrs)

{
  char *pcVar1;
  allocator local_51;
  string local_50;
  unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> local_30;
  Up *local_28;
  Up *attrs_local;
  DataLocation *lenLoc_local;
  DynamicLengthBlobType *pDStack_10;
  uint align_local;
  DynamicLengthBlobType *this_local;
  
  local_28 = attrs;
  attrs_local = (Up *)lenLoc;
  lenLoc_local._4_4_ = align;
  pDStack_10 = this;
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::unique_ptr
            (&local_30,attrs);
  pcVar1 = BlobType::defaultMediaType();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,pcVar1,&local_51);
  BlobType::BlobType(&this->super_BlobType,_kindDlBlob,align,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            (&local_30);
  (this->super_BlobType).super_ScalarDataType.super_DataType._vptr_DataType =
       (_func_int **)&PTR__DynamicLengthBlobType_007e5960;
  DataLocation::DataLocation(&this->_lenLoc,lenLoc);
  std::
  unordered_set<const_yactfr::DataType_*,_std::hash<const_yactfr::DataType_*>,_std::equal_to<const_yactfr::DataType_*>,_std::allocator<const_yactfr::DataType_*>_>
  ::unordered_set(&this->_theLenTypes);
  return;
}

Assistant:

DynamicLengthBlobType::DynamicLengthBlobType(const unsigned int align, DataLocation lenLoc,
                                             MapItem::Up attrs) :
    BlobType {_kindDlBlob, align, std::move(attrs)},
    _lenLoc {std::move(lenLoc)}
{
}